

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O0

CURLcode tftp_send_first(tftp_state_data *state,tftp_event_t event)

{
  uint uVar1;
  Curl_easy *data_00;
  CURLcode CVar2;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  char *pcVar6;
  curl_off_t local_1d8;
  char local_1a8 [8];
  char buffer [256];
  char local_98 [8];
  char buf [64];
  CURLcode local_4c;
  CURLcode result;
  Curl_easy *data;
  char *filename;
  char *mode;
  ssize_t senddata;
  size_t sbytes;
  tftp_state_data *ptStack_18;
  tftp_event_t event_local;
  tftp_state_data *state_local;
  
  filename = "octet";
  data_00 = state->data;
  local_4c = CURLE_OK;
  if ((*(uint *)&(data_00->state).field_0x7be >> 0xe & 1) != 0) {
    filename = "netascii";
  }
  sbytes._4_4_ = event;
  ptStack_18 = state;
  switch(event) {
  case TFTP_EVENT_INIT:
  case TFTP_EVENT_TIMEOUT:
    state->retries = state->retries + 1;
    if (state->retry_max < state->retries) {
      state->error = TFTP_ERR_NORESPONSE;
      state->state = TFTP_STATE_FIN;
      return CURLE_OK;
    }
    if ((*(uint *)&(data_00->state).field_0x7be >> 0x13 & 1) == 0) {
      setpacketevent(&state->spacket,1);
    }
    else {
      setpacketevent(&state->spacket,2);
      if ((data_00->state).infilesize != -1) {
        Curl_pgrsSetUploadSize(data_00,(data_00->state).infilesize);
      }
    }
    CVar2 = Curl_urldecode((ptStack_18->data->state).up.path + 1,0,(char **)&data,(size_t *)0x0,
                           REJECT_ZERO);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    sVar3 = strlen((char *)data);
    uVar1 = ptStack_18->blksize;
    sVar4 = strlen(filename);
    if ((uVar1 - sVar4) - 4 < sVar3) {
      Curl_failf(data_00,"TFTP filename too long");
      (*Curl_cfree)(data);
      return CURLE_TFTP_ILLEGAL;
    }
    curl_msnprintf((char *)((ptStack_18->spacket).data + 2),(ulong)ptStack_18->blksize,"%s%c%s%c",
                   data,0,filename,0);
    sVar3 = strlen((char *)data);
    sVar4 = strlen(filename);
    senddata = sVar3 + 4 + sVar4;
    local_4c = CURLE_OK;
    if ((*(ulong *)&(data_00->set).field_0x89c >> 5 & 1) == 0) {
      if (((*(uint *)&(data_00->state).field_0x7be >> 0x13 & 1) == 0) ||
         ((data_00->state).infilesize == -1)) {
        local_1d8 = 0;
      }
      else {
        local_1d8 = (data_00->state).infilesize;
      }
      curl_msnprintf(local_98,0x40,"%ld",local_1d8);
      local_4c = tftp_option_add(ptStack_18,(size_t *)&senddata,
                                 (char *)((ptStack_18->spacket).data + senddata),"tsize");
      if (local_4c == CURLE_OK) {
        local_4c = tftp_option_add(ptStack_18,(size_t *)&senddata,
                                   (char *)((ptStack_18->spacket).data + senddata),local_98);
      }
      curl_msnprintf(local_98,0x40,"%d",(ulong)ptStack_18->requested_blksize);
      if (local_4c == CURLE_OK) {
        local_4c = tftp_option_add(ptStack_18,(size_t *)&senddata,
                                   (char *)((ptStack_18->spacket).data + senddata),"blksize");
      }
      if (local_4c == CURLE_OK) {
        local_4c = tftp_option_add(ptStack_18,(size_t *)&senddata,
                                   (char *)((ptStack_18->spacket).data + senddata),local_98);
      }
      curl_msnprintf(local_98,0x40,"%d");
      if (local_4c == CURLE_OK) {
        local_4c = tftp_option_add(ptStack_18,(size_t *)&senddata,
                                   (char *)((ptStack_18->spacket).data + senddata),"timeout");
      }
      if (local_4c == CURLE_OK) {
        local_4c = tftp_option_add(ptStack_18,(size_t *)&senddata,
                                   (char *)((ptStack_18->spacket).data + senddata),local_98);
      }
      if (local_4c != CURLE_OK) {
        Curl_failf(data_00,"TFTP buffer too small for options");
        (*Curl_cfree)(data);
        return CURLE_TFTP_ILLEGAL;
      }
    }
    mode = (char *)sendto(ptStack_18->sockfd,(ptStack_18->spacket).data,senddata,0,
                          (sockaddr *)&(data_00->conn->remote_addr->_sa_ex_u).addr,
                          data_00->conn->remote_addr->addrlen);
    if (mode != (char *)senddata) {
      piVar5 = __errno_location();
      pcVar6 = Curl_strerror(*piVar5,local_1a8,0x100);
      Curl_failf(data_00,"%s",pcVar6);
    }
    (*Curl_cfree)(data);
    break;
  default:
    Curl_failf(state->data,"tftp_send_first: internal error");
    break;
  case TFTP_EVENT_DATA:
    local_4c = tftp_connect_for_rx(state,event);
    break;
  case TFTP_EVENT_ACK:
    local_4c = tftp_connect_for_tx(state,event);
    break;
  case TFTP_EVENT_ERROR:
    state->state = TFTP_STATE_FIN;
    break;
  case TFTP_EVENT_OACK:
    if ((*(uint *)&(data_00->state).field_0x7be >> 0x13 & 1) == 0) {
      local_4c = tftp_connect_for_rx(state,event);
    }
    else {
      local_4c = tftp_connect_for_tx(state,event);
    }
  }
  return local_4c;
}

Assistant:

static CURLcode tftp_send_first(struct tftp_state_data *state,
                                tftp_event_t event)
{
  size_t sbytes;
  ssize_t senddata;
  const char *mode = "octet";
  char *filename;
  struct Curl_easy *data = state->data;
  CURLcode result = CURLE_OK;

  /* Set ASCII mode if -B flag was used */
  if(data->state.prefer_ascii)
    mode = "netascii";

  switch(event) {

  case TFTP_EVENT_INIT:    /* Send the first packet out */
  case TFTP_EVENT_TIMEOUT: /* Resend the first packet out */
    /* Increment the retry counter, quit if over the limit */
    state->retries++;
    if(state->retries > state->retry_max) {
      state->error = TFTP_ERR_NORESPONSE;
      state->state = TFTP_STATE_FIN;
      return result;
    }

    if(data->state.upload) {
      /* If we are uploading, send an WRQ */
      setpacketevent(&state->spacket, TFTP_EVENT_WRQ);
      if(data->state.infilesize != -1)
        Curl_pgrsSetUploadSize(data, data->state.infilesize);
    }
    else {
      /* If we are downloading, send an RRQ */
      setpacketevent(&state->spacket, TFTP_EVENT_RRQ);
    }
    /* As RFC3617 describes the separator slash is not actually part of the
       filename so we skip the always-present first letter of the path
       string. */
    result = Curl_urldecode(&state->data->state.up.path[1], 0,
                            &filename, NULL, REJECT_ZERO);
    if(result)
      return result;

    if(strlen(filename) > (state->blksize - strlen(mode) - 4)) {
      failf(data, "TFTP filename too long");
      free(filename);
      return CURLE_TFTP_ILLEGAL; /* too long filename field */
    }

    msnprintf((char *)state->spacket.data + 2,
              state->blksize,
              "%s%c%s%c", filename, '\0',  mode, '\0');
    sbytes = 4 + strlen(filename) + strlen(mode);

    /* optional addition of TFTP options */
    if(!data->set.tftp_no_options) {
      char buf[64];
      /* add tsize option */
      msnprintf(buf, sizeof(buf), "%" FMT_OFF_T,
                data->state.upload && (data->state.infilesize != -1) ?
                data->state.infilesize : 0);

      result = tftp_option_add(state, &sbytes,
                               (char *)state->spacket.data + sbytes,
                               TFTP_OPTION_TSIZE);
      if(result == CURLE_OK)
        result = tftp_option_add(state, &sbytes,
                                 (char *)state->spacket.data + sbytes, buf);

      /* add blksize option */
      msnprintf(buf, sizeof(buf), "%d", state->requested_blksize);
      if(result == CURLE_OK)
        result = tftp_option_add(state, &sbytes,
                                 (char *)state->spacket.data + sbytes,
                                 TFTP_OPTION_BLKSIZE);
      if(result == CURLE_OK)
        result = tftp_option_add(state, &sbytes,
                                 (char *)state->spacket.data + sbytes, buf);

      /* add timeout option */
      msnprintf(buf, sizeof(buf), "%d", state->retry_time);
      if(result == CURLE_OK)
        result = tftp_option_add(state, &sbytes,
                                 (char *)state->spacket.data + sbytes,
                                 TFTP_OPTION_INTERVAL);
      if(result == CURLE_OK)
        result = tftp_option_add(state, &sbytes,
                                 (char *)state->spacket.data + sbytes, buf);

      if(result != CURLE_OK) {
        failf(data, "TFTP buffer too small for options");
        free(filename);
        return CURLE_TFTP_ILLEGAL;
      }
    }

    /* the typecase for the 3rd argument is mostly for systems that do
       not have a size_t argument, like older unixes that want an 'int' */
#ifdef __AMIGA__
#define CURL_SENDTO_ARG5(x) CURL_UNCONST(x)
#else
#define CURL_SENDTO_ARG5(x) (x)
#endif
    senddata = sendto(state->sockfd, (void *)state->spacket.data,
                      (SEND_TYPE_ARG3)sbytes, 0,
                      CURL_SENDTO_ARG5(&data->conn->remote_addr->curl_sa_addr),
                      (curl_socklen_t)data->conn->remote_addr->addrlen);
    if(senddata != (ssize_t)sbytes) {
      char buffer[STRERROR_LEN];
      failf(data, "%s", Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
    }
    free(filename);
    break;

  case TFTP_EVENT_OACK:
    if(data->state.upload) {
      result = tftp_connect_for_tx(state, event);
    }
    else {
      result = tftp_connect_for_rx(state, event);
    }
    break;

  case TFTP_EVENT_ACK: /* Connected for transmit */
    result = tftp_connect_for_tx(state, event);
    break;

  case TFTP_EVENT_DATA: /* Connected for receive */
    result = tftp_connect_for_rx(state, event);
    break;

  case TFTP_EVENT_ERROR:
    state->state = TFTP_STATE_FIN;
    break;

  default:
    failf(state->data, "tftp_send_first: internal error");
    break;
  }

  return result;
}